

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

void __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FreeBucket(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
          DListBase<Memory::CustomHeap::Page,_RealCount> *bucket,bool freeOnlyEmptyPages)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DListNodeBase<Memory::CustomHeap::Page> *node;
  Page *pPVar4;
  Page *page;
  EditingIterator pageIter;
  bool freeOnlyEmptyPages_local;
  DListBase<Memory::CustomHeap::Page,_RealCount> *bucket_local;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  pageIter.super_Iterator.current._7_1_ = freeOnlyEmptyPages;
  if ((this->inDtor & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x3da,"(inDtor)","inDtor");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DListBase<Memory::CustomHeap::Page,_RealCount>::EditingIterator::EditingIterator
            ((EditingIterator *)&page,bucket);
  while( true ) {
    if (pageIter.super_Iterator.list == (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pPVar4 = page;
    node = DListNodeBase<Memory::CustomHeap::Page>::Next
                     (&(pageIter.super_Iterator.list)->super_DListNodeBase<Memory::CustomHeap::Page>
                     );
    bVar2 = DListBase<Memory::CustomHeap::Page,_RealCount>::IsHead
                      ((DListBase<Memory::CustomHeap::Page,_RealCount> *)pPVar4,node);
    if (bVar2) break;
    pageIter.super_Iterator.list =
         (DListBase<Memory::CustomHeap::Page,_RealCount> *)
         DListNodeBase<Memory::CustomHeap::Page>::Next
                   (&(pageIter.super_Iterator.list)->super_DListNodeBase<Memory::CustomHeap::Page>);
    pPVar4 = DListBase<Memory::CustomHeap::Page,_RealCount>::Iterator::Data((Iterator *)&page);
    if (((pageIter.super_Iterator.current._7_1_ & 1) == 0) || (bVar2 = Page::IsEmpty(pPVar4), bVar2)
       ) {
      FreePage(this,pPVar4);
      DListBase<Memory::CustomHeap::Page,_RealCount>::EditingIterator::
      RemoveCurrent<Memory::ArenaAllocator>((EditingIterator *)&page,this->auxiliaryAllocator);
    }
  }
  return;
}

Assistant:

void Heap<TAlloc, TPreReservedAlloc>::FreeBucket(DListBase<Page>* bucket, bool freeOnlyEmptyPages)
{
    // CodePageAllocators is locked in FreeAll
    Assert(inDtor);
    FOREACH_DLISTBASE_ENTRY_EDITING(Page, page, bucket, pageIter)
    {
        // Templatize this to remove branches/make code more compact?
        if (!freeOnlyEmptyPages || page.IsEmpty())
        {
            FreePage(&page);
            pageIter.RemoveCurrent(this->auxiliaryAllocator);
        }
    }
    NEXT_DLISTBASE_ENTRY_EDITING;
}